

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O2

void __thiscall ASN1Test_StringToUTF8_Test::TestBody(ASN1Test_StringToUTF8_Test *this)

{
  pointer data;
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer *__ptr;
  long lVar4;
  char *pcVar5;
  char *in_R9;
  int *message;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  initializer_list<unsigned_char> __l_12;
  initializer_list<unsigned_char> __l_13;
  initializer_list<unsigned_char> __l_14;
  initializer_list<unsigned_char> __l_15;
  AssertionResult gtest_ar_;
  uint8_t *utf8;
  ScopedTrace gtest_trace_918;
  ScopedTrace gtest_trace_917;
  Bytes local_a8;
  allocator_type local_92;
  uchar local_91;
  allocator_type local_90;
  allocator_type local_8f;
  allocator_type local_8e;
  allocator_type local_8d;
  allocator_type local_8c;
  allocator_type local_8b;
  allocator_type local_8a;
  allocator_type local_89;
  allocator_type local_88;
  allocator_type local_87;
  allocator_type local_86;
  allocator_type local_85;
  allocator_type local_84;
  allocator_type local_83;
  allocator_type local_82;
  allocator_type local_81;
  UniquePtr<ASN1_STRING> s;
  AssertionResult gtest_ar;
  uchar local_56 [14];
  long local_48;
  uchar local_40 [16];
  
  if ((TestBody()::kTests == '\0') && (iVar2 = __cxa_guard_acquire(&TestBody()::kTests), iVar2 != 0)
     ) {
    local_56[0] = 0xc0;
    local_56[1] = 0x81;
    __l._M_len = 2;
    __l._M_array = local_56;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0].in,__l,&local_81);
    TestBody::kTests[0].type = 0xc;
    TestBody::kTests[0].expected = (char *)0x0;
    local_56[0xb] = 0xe0;
    local_56[0xc] = 0x80;
    local_56[0xd] = 0x81;
    __l_00._M_len = 3;
    __l_00._M_array = local_56 + 0xb;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[1].in,__l_00,&local_82);
    TestBody::kTests[1].type = 0xc;
    TestBody::kTests[1].expected = (char *)0x0;
    local_a8.span_.data_ = (uchar *)CONCAT44(local_a8.span_.data_._4_4_,0x818080f0);
    __l_01._M_len = 4;
    __l_01._M_array = (iterator)&local_a8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[2].in,__l_01,&local_83);
    TestBody::kTests[2].type = 0xc;
    TestBody::kTests[2].expected = (char *)0x0;
    local_56[8] = 0xf0;
    local_56[9] = 0x80;
    local_56[10] = 0x80;
    __l_02._M_len = 3;
    __l_02._M_array = local_56 + 8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[3].in,__l_02,&local_84);
    TestBody::kTests[3].type = 0xc;
    TestBody::kTests[3].expected = (char *)0x0;
    local_56[5] = 0xed;
    local_56[6] = 0xa0;
    local_56[7] = 0x80;
    __l_03._M_len = 3;
    __l_03._M_array = local_56 + 5;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[4].in,__l_03,&local_85);
    TestBody::kTests[4].type = 0xc;
    TestBody::kTests[4].expected = (char *)0x0;
    local_56[2] = 0xed;
    local_56[3] = 0xb0;
    local_56[4] = 0x81;
    __l_04._M_len = 3;
    __l_04._M_array = local_56 + 2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[5].in,__l_04,&local_86);
    TestBody::kTests[5].type = 0xc;
    TestBody::kTests[5].expected = (char *)0x0;
    s._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl._0_4_ = 0x5800fffe;
    __l_05._M_len = 4;
    __l_05._M_array = (iterator)&s;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[6].in,__l_05,&local_87);
    TestBody::kTests[6].type = 0x1e;
    TestBody::kTests[6].expected = (char *)0x0;
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0x58000000fffe00;
    __l_06._M_len = 8;
    __l_06._M_array = &gtest_ar.success_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[7].in,__l_06,&local_88);
    TestBody::kTests[7].type = 0x1c;
    TestBody::kTests[7].expected = (char *)0x0;
    utf8._0_4_ = 0xfffe5800;
    __l_07._M_len = 4;
    __l_07._M_array = (iterator)&utf8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[8].in,__l_07,&local_89);
    TestBody::kTests[8].type = 0x1e;
    TestBody::kTests[8].expected = anon_var_dwarf_348c9;
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0xfffe0000580000;
    __l_08._M_len = 8;
    __l_08._M_array = &gtest_ar_.success_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[9].in,__l_08,&local_8a);
    TestBody::kTests[9].type = 0x1c;
    TestBody::kTests[9].expected = anon_var_dwarf_348c9;
    _gtest_trace_917 = 0xfdff1000;
    __l_09._M_len = 4;
    __l_09._M_array = (iterator)&gtest_trace_917;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[10].in,__l_09,&local_8b);
    TestBody::kTests[10].type = 0x1c;
    TestBody::kTests[10].expected = anon_var_dwarf_348d6;
    _gtest_trace_918 = 0x1100;
    __l_10._M_len = 4;
    __l_10._M_array = (iterator)&gtest_trace_918;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0xb].in,__l_10,&local_8c);
    TestBody::kTests[0xb].type = 0x1c;
    TestBody::kTests[0xb].expected = (char *)0x0;
    local_40[0xc] = '\0';
    local_40[0xd] = '\x01';
    local_40[0xe] = 0xff;
    local_40[0xf] = 0xff;
    __l_11._M_len = 4;
    __l_11._M_array = local_40 + 0xc;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0xc].in,__l_11,&local_8d);
    TestBody::kTests[0xc].type = 0x1c;
    TestBody::kTests[0xc].expected = (char *)0x0;
    local_40[8] = '\0';
    local_40[9] = '\x01';
    local_40[10] = 0xff;
    local_40[0xb] = 0xfe;
    __l_12._M_len = 4;
    __l_12._M_array = local_40 + 8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0xd].in,__l_12,&local_8e);
    TestBody::kTests[0xd].type = 0x1c;
    TestBody::kTests[0xd].expected = (char *)0x0;
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = 0xfd;
    local_40[7] = 0xd5;
    __l_13._M_len = 4;
    __l_13._M_array = local_40 + 4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0xe].in,__l_13,&local_8f);
    TestBody::kTests[0xe].type = 0x1c;
    TestBody::kTests[0xe].expected = (char *)0x0;
    local_40[0] = 0xd8;
    local_40[1] = '\0';
    local_40[2] = 0xdc;
    local_40[3] = '\x01';
    __l_14._M_len = 4;
    __l_14._M_array = local_40;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0xf].in,__l_14,&local_90);
    TestBody::kTests[0xf].type = 0x1e;
    TestBody::kTests[0xf].expected = (char *)0x0;
    local_91 = '\x01';
    __l_15._M_len = 1;
    __l_15._M_array = &local_91;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0x10].in,__l_15,&local_92);
    TestBody::kTests[0x10].type = 2;
    TestBody::kTests[0x10].expected = (char *)0x0;
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&TestBody()::kTests);
  }
  lVar4 = 0x2a8;
  message = &TestBody::kTests[0].type;
  while( true ) {
    if (lVar4 == 0) {
      return;
    }
    gtest_ar._0_8_ =
         (((anon_struct_40_3_dfaa98aa *)(message + -6))->in).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )((long)*(pointer *)(message + -4) - gtest_ar._0_8_);
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&gtest_trace_917,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x395,(Bytes *)&gtest_ar);
    testing::ScopedTrace::ScopedTrace<int>
              (&gtest_trace_918,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x396,message);
    s._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
         ASN1_STRING_type_new(*message);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    bVar1 = (tuple<asn1_string_st_*,_bssl::internal::Deleter>)
            s._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl !=
            (_Head_base<0UL,_asn1_string_st_*,_false>)0x0;
    gtest_ar_.success_ = bVar1;
    if ((tuple<asn1_string_st_*,_bssl::internal::Deleter>)
        s._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_asn1_string_st_*,_false>)0x0) break;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    data = (((anon_struct_40_3_dfaa98aa *)(message + -6))->in).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    iVar2 = ASN1_STRING_set((ASN1_STRING *)
                            s._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>.
                            _M_t.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,data,
                            (int)*(pointer *)(message + -4) - (int)data);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar2 != 0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"ASN1_STRING_set(s.get(), test.in.data(), test.in.size())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&utf8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x399,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&utf8,(Message *)&local_a8);
      goto LAB_001aee2d;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    uVar3 = ASN1_STRING_to_UTF8(&utf8,(ASN1_STRING *)
                                      s._M_t.
                                      super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl);
    gtest_ar_.success_ = SUB41(uVar3 >> 0x1f,0);
    local_a8.span_.data_ =
         (uchar *)CONCAT71(local_a8.span_.data_._1_7_,*(char **)(message + 2) == (char *)0x0);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar,"utf8_len < 0","test.expected == nullptr",&gtest_ar_.success_,
               (bool *)&local_a8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar5 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x39d,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    if ((int)uVar3 < 0) {
      ERR_clear_error();
    }
    else {
      pcVar5 = *(char **)(message + 2);
      local_48 = lVar4;
      if (pcVar5 != (char *)0x0) {
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )strlen(pcVar5);
        local_a8.span_.data_ = (uchar *)CONCAT44(utf8._4_4_,utf8._0_4_);
        local_a8.span_.size_ = (size_t)uVar3;
        gtest_ar_._0_8_ = pcVar5;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)&gtest_ar,"Bytes(test.expected)","Bytes(utf8, utf8_len)",
                   (Bytes *)&gtest_ar_,&local_a8);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar5 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar5 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x3a0,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_a8,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
      }
      OPENSSL_free((void *)CONCAT44(utf8._4_4_,utf8._0_4_));
      lVar4 = local_48;
    }
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&s);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_918);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_917);
    lVar4 = lVar4 + -0x28;
    message = message + 10;
  }
  testing::Message::Message((Message *)&local_a8);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x50cf3d,"false","true",
             in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&utf8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
             ,0x398,(char *)gtest_ar._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&utf8,(Message *)&local_a8);
LAB_001aee2d:
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utf8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((long *)local_a8.span_.data_ != (long *)0x0) {
    (**(code **)(*(long *)local_a8.span_.data_ + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&s);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_918);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_917);
  return;
}

Assistant:

TEST(ASN1Test, StringToUTF8) {
  static const struct {
    std::vector<uint8_t> in;
    int type;
    const char *expected;
  } kTests[] = {
      // Non-minimal, two-byte UTF-8.
      {{0xc0, 0x81}, V_ASN1_UTF8STRING, nullptr},
      // Non-minimal, three-byte UTF-8.
      {{0xe0, 0x80, 0x81}, V_ASN1_UTF8STRING, nullptr},
      // Non-minimal, four-byte UTF-8.
      {{0xf0, 0x80, 0x80, 0x81}, V_ASN1_UTF8STRING, nullptr},
      // Truncated, four-byte UTF-8.
      {{0xf0, 0x80, 0x80}, V_ASN1_UTF8STRING, nullptr},
      // Low-surrogate value.
      {{0xed, 0xa0, 0x80}, V_ASN1_UTF8STRING, nullptr},
      // High-surrogate value.
      {{0xed, 0xb0, 0x81}, V_ASN1_UTF8STRING, nullptr},
      // Initial BOMs should be rejected from UCS-2 and UCS-4.
      {{0xfe, 0xff, 0, 88}, V_ASN1_BMPSTRING, nullptr},
      {{0, 0, 0xfe, 0xff, 0, 0, 0, 88}, V_ASN1_UNIVERSALSTRING, nullptr},
      // Otherwise, BOMs should pass through.
      {{0, 88, 0xfe, 0xff}, V_ASN1_BMPSTRING, "X\xef\xbb\xbf"},
      {{0, 0, 0, 88, 0, 0, 0xfe, 0xff},
       V_ASN1_UNIVERSALSTRING,
       "X\xef\xbb\xbf"},
      // The maximum code-point should pass though.
      {{0, 16, 0xff, 0xfd}, V_ASN1_UNIVERSALSTRING, "\xf4\x8f\xbf\xbd"},
      // Values outside the Unicode space should not.
      {{0, 17, 0, 0}, V_ASN1_UNIVERSALSTRING, nullptr},
      // Non-characters should be rejected.
      {{0, 1, 0xff, 0xff}, V_ASN1_UNIVERSALSTRING, nullptr},
      {{0, 1, 0xff, 0xfe}, V_ASN1_UNIVERSALSTRING, nullptr},
      {{0, 0, 0xfd, 0xd5}, V_ASN1_UNIVERSALSTRING, nullptr},
      // BMPString is UCS-2, not UTF-16, so surrogate pairs are invalid.
      {{0xd8, 0, 0xdc, 1}, V_ASN1_BMPSTRING, nullptr},
      // INTEGERs are stored as strings, but cannot be converted to UTF-8.
      {{0x01}, V_ASN1_INTEGER, nullptr},
  };

  for (const auto &test : kTests) {
    SCOPED_TRACE(Bytes(test.in));
    SCOPED_TRACE(test.type);
    bssl::UniquePtr<ASN1_STRING> s(ASN1_STRING_type_new(test.type));
    ASSERT_TRUE(s);
    ASSERT_TRUE(ASN1_STRING_set(s.get(), test.in.data(), test.in.size()));

    uint8_t *utf8;
    const int utf8_len = ASN1_STRING_to_UTF8(&utf8, s.get());
    EXPECT_EQ(utf8_len < 0, test.expected == nullptr);
    if (utf8_len >= 0) {
      if (test.expected != nullptr) {
        EXPECT_EQ(Bytes(test.expected), Bytes(utf8, utf8_len));
      }
      OPENSSL_free(utf8);
    } else {
      ERR_clear_error();
    }
  }
}